

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O0

JSON * __thiscall phosg::JSON::operator=(JSON *this,JSON *rhs)

{
  bool bVar1;
  char *pcVar2;
  variant_alternative_t<1UL,_variant<std::nullptr_t,_bool,_long,_double,_basic_string<char,_char_traits<char>,_allocator<char>_>,_vector<unique_ptr<JSON,_default_delete<JSON>_>,_allocator<unique_ptr<JSON,_default_delete<JSON>_>_>_>,_unordered_map<basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>,_hash<string>,_equal_to<basic_string<char,_char_traits<char>,_allocator<char>_>_>,_allocator<pair<const_basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>_>_>_>_>_>
  *__rhs;
  variant_alternative_t<2UL,_variant<std::nullptr_t,_bool,_long,_double,_basic_string<char,_char_traits<char>,_allocator<char>_>,_vector<unique_ptr<JSON,_default_delete<JSON>_>,_allocator<unique_ptr<JSON,_default_delete<JSON>_>_>_>,_unordered_map<basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>,_hash<string>,_equal_to<basic_string<char,_char_traits<char>,_allocator<char>_>_>,_allocator<pair<const_basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>_>_>_>_>_>
  *__rhs_00;
  variant_alternative_t<3UL,_variant<std::nullptr_t,_bool,_long,_double,_basic_string<char,_char_traits<char>,_allocator<char>_>,_vector<unique_ptr<JSON,_default_delete<JSON>_>,_allocator<unique_ptr<JSON,_default_delete<JSON>_>_>_>,_unordered_map<basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>,_hash<string>,_equal_to<basic_string<char,_char_traits<char>,_allocator<char>_>_>,_allocator<pair<const_basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>_>_>_>_>_>
  *__rhs_01;
  variant_alternative_t<4UL,_variant<std::nullptr_t,_bool,_long,_double,_basic_string<char,_char_traits<char>,_allocator<char>_>,_vector<unique_ptr<JSON,_default_delete<JSON>_>,_allocator<unique_ptr<JSON,_default_delete<JSON>_>_>_>,_unordered_map<basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>,_hash<string>,_equal_to<basic_string<char,_char_traits<char>,_allocator<char>_>_>,_allocator<pair<const_basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>_>_>_>_>_>
  *__rhs_02;
  vector<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::allocator<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>
  *this_00;
  size_t __n;
  variant_alternative_t<5UL,_variant<std::nullptr_t,_bool,_long,_double,_basic_string<char,_char_traits<char>,_allocator<char>_>,_vector<unique_ptr<JSON,_default_delete<JSON>_>,_allocator<unique_ptr<JSON,_default_delete<JSON>_>_>_>,_unordered_map<basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>,_hash<string>,_equal_to<basic_string<char,_char_traits<char>,_allocator<char>_>_>,_allocator<pair<const_basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>_>_>_>_>_>
  *this_01;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>,_false,_true>,_bool>
  *__return_storage_ptr__;
  variant_alternative_t<6UL,_variant<std::nullptr_t,_bool,_long,_double,_basic_string<char,_char_traits<char>,_allocator<char>_>,_vector<unique_ptr<JSON,_default_delete<JSON>_>,_allocator<unique_ptr<JSON,_default_delete<JSON>_>_>_>,_unordered_map<basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>,_hash<string>,_equal_to<basic_string<char,_char_traits<char>,_allocator<char>_>_>,_allocator<pair<const_basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>_>_>_>_>_>
  *this_02;
  reference this_03;
  JSON *pJVar3;
  type pJVar4;
  logic_error *this_04;
  uint *__args_1;
  int in_EDX;
  undefined1 local_e0 [16];
  value_type *it;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  variant_alternative_t<6UL,_variant<std::nullptr_t,_bool,_long,_double,_basic_string<char,_char_traits<char>,_allocator<char>_>,_vector<unique_ptr<JSON,_default_delete<JSON>_>,_allocator<unique_ptr<JSON,_default_delete<JSON>_>_>_>,_unordered_map<basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>,_hash<string>,_equal_to<basic_string<char,_char_traits<char>,_allocator<char>_>_>,_allocator<pair<const_basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>_>_>_>_>_>
  *__range3_1;
  variant_alternative_t<6UL,_variant<std::nullptr_t,_bool,_long,_double,_basic_string<char,_char_traits<char>,_allocator<char>_>,_vector<unique_ptr<JSON,_default_delete<JSON>_>,_allocator<unique_ptr<JSON,_default_delete<JSON>_>_>_>,_unordered_map<basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>,_hash<string>,_equal_to<basic_string<char,_char_traits<char>,_allocator<char>_>_>,_allocator<pair<const_basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>_>_>_>_>_>
  *v_1;
  JSON *local_68;
  unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_> *local_60;
  unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_> *item;
  const_iterator __end3;
  const_iterator __begin3;
  variant_alternative_t<5UL,_variant<std::nullptr_t,_bool,_long,_double,_basic_string<char,_char_traits<char>,_allocator<char>_>,_vector<unique_ptr<JSON,_default_delete<JSON>_>,_allocator<unique_ptr<JSON,_default_delete<JSON>_>_>_>,_unordered_map<basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>,_hash<string>,_equal_to<basic_string<char,_char_traits<char>,_allocator<char>_>_>,_allocator<pair<const_basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>_>_>_>_>_>
  *__range3;
  variant_alternative_t<5UL,_variant<std::nullptr_t,_bool,_long,_double,_basic_string<char,_char_traits<char>,_allocator<char>_>,_vector<unique_ptr<JSON,_default_delete<JSON>_>,_allocator<unique_ptr<JSON,_default_delete<JSON>_>_>_>,_unordered_map<basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>,_hash<string>,_equal_to<basic_string<char,_char_traits<char>,_allocator<char>_>_>,_allocator<pair<const_basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>_>_>_>_>_>
  *v;
  void *local_20;
  variant<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
  *local_18;
  JSON *rhs_local;
  JSON *this_local;
  
  local_18 = &rhs->value;
  rhs_local = this;
  pcVar2 = ::std::
           variant<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
           ::index(&rhs->value,(char *)rhs,in_EDX);
  __args_1 = &switchD_00121b10::switchdataD_00145994;
  switch(pcVar2) {
  case (char *)0x0:
    local_20 = (void *)0x0;
    ::std::
    variant<decltype(nullptr),bool,long,double,std::__cxx11::string,std::vector<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::allocator<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>,std::unordered_map<std::__cxx11::string,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>>>
    ::operator=((variant<decltype(nullptr),bool,long,double,std::__cxx11::string,std::vector<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::allocator<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>,std::unordered_map<std::__cxx11::string,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>>>
                 *)this,&local_20);
    break;
  case (char *)0x1:
    __rhs = ::std::
            get<1ul,decltype(nullptr),bool,long,double,std::__cxx11::string,std::vector<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::allocator<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>,std::unordered_map<std::__cxx11::string,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>>>
                      (local_18);
    ::std::
    variant<decltype(nullptr),bool,long,double,std::__cxx11::string,std::vector<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::allocator<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>,std::unordered_map<std::__cxx11::string,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>>>
    ::operator=((variant<decltype(nullptr),bool,long,double,std::__cxx11::string,std::vector<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::allocator<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>,std::unordered_map<std::__cxx11::string,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>>>
                 *)this,__rhs);
    break;
  case (char *)0x2:
    __rhs_00 = ::std::
               get<2ul,decltype(nullptr),bool,long,double,std::__cxx11::string,std::vector<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::allocator<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>,std::unordered_map<std::__cxx11::string,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>>>
                         (local_18);
    ::std::
    variant<decltype(nullptr),bool,long,double,std::__cxx11::string,std::vector<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::allocator<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>,std::unordered_map<std::__cxx11::string,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>>>
    ::operator=((variant<decltype(nullptr),bool,long,double,std::__cxx11::string,std::vector<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::allocator<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>,std::unordered_map<std::__cxx11::string,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>>>
                 *)this,__rhs_00);
    break;
  case (char *)0x3:
    __rhs_01 = ::std::
               get<3ul,decltype(nullptr),bool,long,double,std::__cxx11::string,std::vector<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::allocator<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>,std::unordered_map<std::__cxx11::string,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>>>
                         (local_18);
    ::std::
    variant<decltype(nullptr),bool,long,double,std::__cxx11::string,std::vector<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::allocator<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>,std::unordered_map<std::__cxx11::string,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>>>
    ::operator=((variant<decltype(nullptr),bool,long,double,std::__cxx11::string,std::vector<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::allocator<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>,std::unordered_map<std::__cxx11::string,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>>>
                 *)this,__rhs_01);
    break;
  case (char *)0x4:
    __rhs_02 = ::std::
               get<4ul,decltype(nullptr),bool,long,double,std::__cxx11::string,std::vector<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::allocator<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>,std::unordered_map<std::__cxx11::string,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>>>
                         (local_18);
    ::std::
    variant<decltype(nullptr),bool,long,double,std::__cxx11::string,std::vector<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::allocator<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>,std::unordered_map<std::__cxx11::string,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>>>
    ::operator=((variant<decltype(nullptr),bool,long,double,std::__cxx11::string,std::vector<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::allocator<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>,std::unordered_map<std::__cxx11::string,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>>>
                 *)this,__rhs_02);
    break;
  case (char *)0x5:
    memset(&v,0,0x18);
    ::std::
    vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>
    ::vector((vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>
              *)&v);
    ::std::
    variant<decltype(nullptr),bool,long,double,std::__cxx11::string,std::vector<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::allocator<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>,std::unordered_map<std::__cxx11::string,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>>>
    ::operator=((variant<decltype(nullptr),bool,long,double,std::__cxx11::string,std::vector<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::allocator<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>,std::unordered_map<std::__cxx11::string,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>>>
                 *)this,(vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>
                         *)&v);
    ::std::
    vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>
    ::~vector((vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>
               *)&v);
    this_00 = (vector<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::allocator<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>
               *)::std::
                 get<5ul,decltype(nullptr),bool,long,double,std::__cxx11::string,std::vector<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::allocator<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>,std::unordered_map<std::__cxx11::string,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>>>
                           (&this->value);
    __n = size((JSON *)local_18);
    ::std::
    vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>
    ::reserve((vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>
               *)this_00,__n);
    this_01 = ::std::
              get<5ul,decltype(nullptr),bool,long,double,std::__cxx11::string,std::vector<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::allocator<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>,std::unordered_map<std::__cxx11::string,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>>>
                        (local_18);
    __end3 = ::std::
             vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>
             ::begin(this_01);
    item = (unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_> *)
           ::std::
           vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>
           ::end(this_01);
    while (bVar1 = __gnu_cxx::
                   operator==<const_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_*,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>
                             (&__end3,(__normal_iterator<const_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_*,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>
                                       *)&item), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_60 = __gnu_cxx::
                 __normal_iterator<const_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_*,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>
                 ::operator*(&__end3);
      pJVar3 = (JSON *)operator_new(0x40);
      pJVar4 = ::std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>::operator*
                         (local_60);
      JSON(pJVar3,pJVar4);
      local_68 = pJVar3;
      ::std::
      vector<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::allocator<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>
      ::emplace_back<phosg::JSON*>(this_00,&local_68);
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_*,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>
      ::operator++(&__end3);
    }
    break;
  case (char *)0x6:
    memset(&v_1,0,0x38);
    ::std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>
    ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>
                     *)&v_1);
    ::std::
    variant<decltype(nullptr),bool,long,double,std::__cxx11::string,std::vector<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::allocator<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>,std::unordered_map<std::__cxx11::string,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>>>
    ::operator=((variant<decltype(nullptr),bool,long,double,std::__cxx11::string,std::vector<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::allocator<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>,std::unordered_map<std::__cxx11::string,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>>>
                 *)this,(unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>
                         *)&v_1);
    ::std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>
    ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>
                      *)&v_1);
    __return_storage_ptr__ =
         (pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>,_false,_true>,_bool>
          *)::std::
            get<6ul,decltype(nullptr),bool,long,double,std::__cxx11::string,std::vector<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::allocator<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>,std::unordered_map<std::__cxx11::string,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>>>
                      (&this->value);
    this_02 = ::std::
              get<6ul,decltype(nullptr),bool,long,double,std::__cxx11::string,std::vector<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::allocator<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>,std::unordered_map<std::__cxx11::string,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>>>
                        (local_18);
    __end3_1 = ::std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>
               ::begin(this_02);
    it = (value_type *)
         ::std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>
         ::end(this_02);
    while (bVar1 = ::std::__detail::operator==
                             (&__end3_1.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>,_true>
                              ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>,_true>
                                *)&it), ((bVar1 ^ 0xffU) & 1) != 0) {
      this_03 = ::std::__detail::
                _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>,_false,_true>
                ::operator*(&__end3_1);
      local_e0._8_8_ = this_03;
      pJVar3 = (JSON *)operator_new(0x40);
      pJVar4 = ::std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>::operator*
                         ((unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_> *)
                          (local_e0._8_8_ + 0x20));
      JSON(pJVar3,pJVar4);
      local_e0._0_8_ = pJVar3;
      ::std::
      unordered_map<std::__cxx11::string,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>>
      ::emplace<std::__cxx11::string_const&,phosg::JSON*>
                (__return_storage_ptr__,this_03,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                 (JSON **)__args_1);
      ::std::__detail::
      _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>,_false,_true>
      ::operator++(&__end3_1);
    }
    break;
  default:
    this_04 = (logic_error *)__cxa_allocate_exception(0x10);
    ::std::logic_error::logic_error(this_04,"invalid JSON value type");
    __cxa_throw(this_04,&::std::logic_error::typeinfo,::std::logic_error::~logic_error);
  }
  return this;
}

Assistant:

JSON& JSON::operator=(const JSON& rhs) {
  switch (rhs.value.index()) {
    case 0:
      this->value = nullptr;
      break;
    case 1:
      this->value = ::get<1>(rhs.value);
      break;
    case 2:
      this->value = ::get<2>(rhs.value);
      break;
    case 3:
      this->value = ::get<3>(rhs.value);
      break;
    case 4:
      this->value = ::get<4>(rhs.value);
      break;
    case 5: {
      this->value = vector<unique_ptr<JSON>>();
      auto& v = ::get<5>(this->value);
      v.reserve(rhs.size());
      for (const auto& item : (::get<5>(rhs.value))) {
        v.emplace_back(new JSON(*item));
      }
      break;
    }
    case 6: {
      this->value = unordered_map<string, unique_ptr<JSON>>();
      auto& v = ::get<6>(this->value);
      for (const auto& it : (::get<6>(rhs.value))) {
        v.emplace(it.first, new JSON(*it.second));
      }
      break;
    }
    default:
      throw logic_error("invalid JSON value type");
  }
  return *this;
}